

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Lexer::ParseWhitespaceAndNewlines(Lexer *this)

{
  bool bVar1;
  Lexer *this_local;
  
  while ((bVar1 = IsEndOfText(this), ((bVar1 ^ 0xffU) & 1) != 0 &&
         ((bVar1 = IsWhitespace(this,*this->m_current), bVar1 ||
          (bVar1 = IsNewline(this,*this->m_current), bVar1))))) {
    AdvanceCurrent(this);
  }
  this->m_columnMarker = this->m_columnNumber;
  return;
}

Assistant:

inline_t void Lexer::ParseWhitespaceAndNewlines()
	{
		while (!IsEndOfText())
		{
			if (!IsWhitespace(*m_current) && !IsNewline(*m_current))
				break;
			AdvanceCurrent();
		}
		m_columnMarker = m_columnNumber;
	}